

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeView::currentChanged(QTreeView *this,QModelIndex *current,QModelIndex *previous)

{
  QTreeViewPrivate *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QRect local_50;
  QTreeView *pQStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemView::currentChanged((QAbstractItemView *)this,current,previous);
  if (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8 + 0x5c5) == '\x01') {
    if (((-1 < previous->r) && (-1 < previous->c)) &&
       ((previous->m).ptr != (QAbstractItemModel *)0x0)) {
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      local_50 = QTreeViewPrivate::visualRect(this_00,previous,FullRow);
      QWidget::update(pQVar4,&local_50);
    }
    if (((-1 < current->r) && (-1 < current->c)) && ((current->m).ptr != (QAbstractItemModel *)0x0))
    {
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      local_50 = QTreeViewPrivate::visualRect(this_00,current,FullRow);
      QWidget::update(pQVar4,&local_50);
    }
  }
  cVar1 = QAccessible::isActive();
  if (((cVar1 != '\0') && (-1 < current->r)) &&
     ((-1 < current->c && ((current->m).ptr != (QAbstractItemModel *)0x0)))) {
    bVar2 = QWidget::hasFocus((QWidget *)this);
    if (bVar2) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_50.x2.m_i = 0x8005;
      local_50._0_8_ = QFont::strikeOut;
      local_50.y2.m_i = -0x55555556;
      pQStack_40 = this;
      iVar3 = QTreeViewPrivate::accessibleTree2Index
                        (*(QTreeViewPrivate **)
                          &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8,current);
      local_38 = (undefined1 *)CONCAT44(local_38._4_4_,iVar3);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QTreeView);
    QAbstractItemView::currentChanged(current, previous);

    if (allColumnsShowFocus()) {
        if (previous.isValid())
            viewport()->update(d->visualRect(previous, QTreeViewPrivate::FullRow));
        if (current.isValid())
            viewport()->update(d->visualRect(current, QTreeViewPrivate::FullRow));
    }
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && current.isValid() && hasFocus()) {
        Q_D(QTreeView);

        QAccessibleEvent event(this, QAccessible::Focus);
        event.setChild(d->accessibleTree2Index(current));
        QAccessible::updateAccessibility(&event);
    }
#endif
}